

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O3

Expression * __thiscall wasm::TranslateToFuzzReader::makeMemoryCopy(TranslateToFuzzReader *this)

{
  __uniq_ptr_data<wasm::Memory,_std::default_delete<wasm::Memory>,_true,_true> _Var1;
  uintptr_t uVar2;
  uintptr_t uVar3;
  uintptr_t uVar4;
  uintptr_t uVar5;
  Expression *pEVar6;
  Expression *pEVar7;
  Expression *pEVar8;
  Expression *pEVar9;
  
  if (this->allowMemory != false) {
    pEVar6 = makePointer(this);
    pEVar7 = makePointer(this);
    pEVar8 = make(this,(Type)*(uintptr_t *)
                              ((long)(((this->wasm->memories).
                                       super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                     super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>
                              + 0x50));
    _Var1.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
    super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
         (((this->wasm->memories).
           super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_M_t).
         super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>;
    uVar2 = *(uintptr_t *)
             _Var1.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
             super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
    uVar3 = *(uintptr_t *)
             ((long)_Var1.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>.
                    _M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                    super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 8);
    uVar4 = *(uintptr_t *)
             _Var1.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
             super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
    uVar5 = *(uintptr_t *)
             ((long)_Var1.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>.
                    _M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                    super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 8);
    pEVar9 = (Expression *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x48,8);
    *(undefined8 *)pEVar9 = 0;
    (pEVar9->type).id = 0;
    pEVar9->_id = MemoryCopyId;
    *(Expression **)(pEVar9 + 1) = pEVar6;
    pEVar9[1].type.id = (uintptr_t)pEVar7;
    *(Expression **)(pEVar9 + 2) = pEVar8;
    pEVar9[2].type.id = uVar2;
    *(uintptr_t *)(pEVar9 + 3) = uVar3;
    pEVar9[3].type.id = uVar4;
    *(uintptr_t *)(pEVar9 + 4) = uVar5;
    wasm::MemoryCopy::finalize();
    return pEVar9;
  }
  pEVar6 = makeTrivial(this,(Type)0x0);
  return pEVar6;
}

Assistant:

Expression* TranslateToFuzzReader::makeMemoryCopy() {
  if (!allowMemory) {
    return makeTrivial(Type::none);
  }
  Expression* dest = makePointer();
  Expression* source = makePointer();
  Expression* size = make(wasm.memories[0]->addressType);
  return builder.makeMemoryCopy(
    dest, source, size, wasm.memories[0]->name, wasm.memories[0]->name);
}